

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::
StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
::convert_abi_cxx11_
          (string *__return_storage_ptr__,
          StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
          *this,time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *time_point)

{
  duration<long,_std::ratio<1L,_1000000000L>_> *e;
  rep local_40;
  string local_38;
  StringMaker<std::chrono::time_point<hta::Clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,void>
  *local_18;
  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  *time_point_local;
  
  local_18 = this;
  time_point_local =
       (time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *)
       __return_storage_ptr__;
  local_40 = (rep)clara::std::chrono::
                  time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                  ::time_since_epoch((time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                      *)this);
  Detail::stringify<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
            (&local_38,(Detail *)&local_40,e);
  std::operator+(__return_storage_ptr__,&local_38," since epoch");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static std::string convert(std::chrono::time_point<Clock, Duration> const& time_point) {
            return ::Catch::Detail::stringify(time_point.time_since_epoch()) + " since epoch";
        }